

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Loop.h
# Opt level: O0

void uWS::Loop::postCb(us_loop_t *loop)

{
  bool bVar1;
  reference this;
  undefined8 in_RDI;
  pair<void_*const,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>_>
  *p;
  iterator __end2;
  iterator __begin2;
  map<void_*,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>_>_>_>
  *__range2;
  LoopData *loopData;
  Loop *in_stack_ffffffffffffffc8;
  _Self local_28;
  _Self local_20;
  long local_18;
  long local_10;
  
  local_10 = us_loop_ext(in_RDI);
  local_18 = local_10 + 0x60;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<void_*,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>_>_>_>
       ::begin((map<void_*,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>_>_>_>
                *)in_stack_ffffffffffffffc8);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<void_*,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>_>_>_>
       ::end((map<void_*,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>_>_>_>
              *)in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    this = std::
           _Rb_tree_iterator<std::pair<void_*const,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>_>_>
           ::operator*((_Rb_tree_iterator<std::pair<void_*const,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>_>_>
                        *)0x2208a3);
    fu2::abi_400::detail::type_erasure::invocation_table::
    operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>,_void_(uWS::Loop_*)>
    ::operator()((operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>,_void_(uWS::Loop_*)>
                  *)this,in_stack_ffffffffffffffc8);
    std::
    _Rb_tree_iterator<std::pair<void_*const,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<void_*const,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>_>_>
                  *)this);
  }
  return;
}

Assistant:

static void postCb(us_loop_t *loop) {
        LoopData *loopData = (LoopData *) us_loop_ext(loop);

        for (auto &p : loopData->postHandlers) {
            p.second((Loop *) loop);
        }
    }